

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

VectorXd * __thiscall
ChebTools::ChebyshevLobattoNodesLibrary::get(ChebyshevLobattoNodesLibrary *this,size_t N)

{
  iterator iVar1;
  size_t local_18;
  
  local_18 = N;
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
          ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)this,&local_18);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->vectors)._M_t._M_impl.super__Rb_tree_header) {
    build(this,local_18);
    iVar1 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
            ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)this,&local_18);
  }
  return (VectorXd *)&iVar1._M_node[1]._M_parent;
}

Assistant:

const Eigen::VectorXd & get(std::size_t N) {
            auto it = vectors.find(N);
            if (it != vectors.end()) {
                return it->second;
            }
            else {
                build(N);
                return vectors.find(N)->second;
            }
        }